

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O2

void __thiscall
cfg::tag_tags_t<cfgfile::string_trait_t>::tag_tags_t
          (tag_tags_t<cfgfile::string_trait_t> *this,string_t *name,bool is_mandatory)

{
  _Rb_tree_header *p_Var1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator local_91;
  string_t local_90;
  string local_70 [32];
  tag_custom_t<cfgfile::string_trait_t> *local_50;
  tag_scalar_vector_t<int,_cfgfile::string_trait_t> *local_48;
  tag_no_value_t<cfgfile::string_trait_t> *local_40;
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *local_38;
  
  cfgfile::tag_no_value_t<cfgfile::string_trait_t>::tag_no_value_t
            (&this->super_tag_no_value_t<cfgfile::string_trait_t>,name,is_mandatory);
  (this->super_tag_no_value_t<cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_tags_t_00138820;
  std::__cxx11::string::string(local_70,"string_field",&local_91);
  std::__cxx11::string::string((string *)&local_90,local_70);
  cfgfile::
  tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  ::tag_scalar_t(&this->m_string_field,(tag_t<cfgfile::string_trait_t> *)this,&local_90,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  (this->m_string_field_constraint).
  super_constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_constraint_t = (_func_int **)&PTR__constraint_one_of_t_001388e0;
  p_Var1 = &(this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_string_field_constraint).m_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_38 = &this->m_string_field;
  std::__cxx11::string::string(local_70,"no_value_field",&local_91);
  std::__cxx11::string::string((string *)&local_90,local_70);
  local_40 = &this->m_no_value_field;
  cfgfile::tag_no_value_t<cfgfile::string_trait_t>::tag_no_value_t
            (local_40,(tag_t<cfgfile::string_trait_t> *)this,&local_90,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"int_field",&local_91);
  std::__cxx11::string::string((string *)&local_90,local_70);
  local_48 = &this->m_int_field;
  cfgfile::tag_scalar_vector_t<int,_cfgfile::string_trait_t>::tag_scalar_vector_t
            (local_48,(tag_t<cfgfile::string_trait_t> *)this,&local_90,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  (this->m_int_field_constraint).super_constraint_t<int>._vptr_constraint_t =
       (_func_int **)&PTR__constraint_t_00138990;
  (this->m_int_field_constraint).m_min = 0;
  (this->m_int_field_constraint).m_max = 500;
  std::__cxx11::string::string(local_70,"custom_field",&local_91);
  std::__cxx11::string::string((string *)&local_90,local_70);
  local_50 = &this->m_custom_field;
  tag_custom_t<cfgfile::string_trait_t>::tag_custom_t
            (local_50,(tag_t<cfgfile::string_trait_t> *)this,&local_90,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"bool_scalar",&local_91);
  std::__cxx11::string::string((string *)&local_90,local_70);
  tag_bool_scalar_t<cfgfile::string_trait_t>::tag_bool_scalar_t
            (&this->m_bool_scalar,(tag_t<cfgfile::string_trait_t> *)this,&local_90,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"int_scalar",&local_91);
  std::__cxx11::string::string((string *)&local_90,local_70);
  tag_int_scalar_t<cfgfile::string_trait_t>::tag_int_scalar_t
            (&this->m_int_scalar,(tag_t<cfgfile::string_trait_t> *)this,&local_90,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"string_scalar",&local_91);
  std::__cxx11::string::string((string *)&local_90,local_70);
  tag_string_scalar_t<cfgfile::string_trait_t>::tag_string_scalar_t
            (&this->m_string_scalar,(tag_t<cfgfile::string_trait_t> *)this,&local_90,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"int_scalar_vector",&local_91);
  std::__cxx11::string::string((string *)&local_90,local_70);
  tag_scalar_vector_t<cfgfile::string_trait_t>::tag_scalar_vector_t
            (&this->m_int_scalar_vector,(tag_t<cfgfile::string_trait_t> *)this,&local_90,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string((string *)&local_90,"one",(allocator *)local_70);
  this_00 = &(this->m_string_field_constraint).m_list;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"two",(allocator *)local_70);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"three",(allocator *)local_70);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  (this->m_string_field).m_constraint =
       &(this->m_string_field_constraint).
        super_constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  (this->m_int_field).m_constraint = &(this->m_int_field_constraint).super_constraint_t<int>;
  return;
}

Assistant:

tag_tags_t( const typename Trait::string_t & name, bool is_mandatory )
		:	cfgfile::tag_no_value_t< Trait >( name, is_mandatory )
		,	m_string_field( *this, Trait::from_ascii( "string_field" ), true )
		,	m_string_field_constraint()
		,	m_no_value_field( *this, Trait::from_ascii( "no_value_field" ), true )
		,	m_int_field( *this, Trait::from_ascii( "int_field" ), true )
		,	m_int_field_constraint( 0, 500 )
		,	m_custom_field( *this, Trait::from_ascii( "custom_field" ), true )
		,	m_bool_scalar( *this, Trait::from_ascii( "bool_scalar" ), true )
		,	m_int_scalar( *this, Trait::from_ascii( "int_scalar" ), true )
		,	m_string_scalar( *this, Trait::from_ascii( "string_scalar" ), true )
		,	m_int_scalar_vector( *this, Trait::from_ascii( "int_scalar_vector" ), true )
	{
		m_string_field_constraint.add_value( "one" );
		m_string_field_constraint.add_value( "two" );
		m_string_field_constraint.add_value( "three" );
		m_string_field.set_constraint( &m_string_field_constraint );

		m_int_field.set_constraint( &m_int_field_constraint );

	}